

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_8x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __m128i *in_00;
  byte in_CL;
  __m128i *in_RSI;
  __m128i *cur_in;
  int i;
  int lr_flip;
  int ud_flip;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoeff128;
  __m128i in [8];
  int local_ec;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  fwd_transform_1d_sse4_1 p_Var5;
  __m128i *out;
  longlong local_a8 [4];
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  __m128i *in_stack_ffffffffffffff88;
  __m128i *in_stack_ffffffffffffff90;
  
  piVar1 = av1_fwd_txfm_shift_ls[6];
  iVar2 = get_txw_idx('\x06');
  iVar3 = get_txh_idx('\x06');
  iVar4 = (int)av1_fwd_cos_bit_col[iVar2][iVar3];
  iVar2 = (int)av1_fwd_cos_bit_row[iVar2][iVar3];
  out = (__m128i *)col_highbd_txfm4x4_arr[in_CL];
  p_Var5 = row_highbd_txfm4x8_arr[in_CL];
  get_flip_cfg(in_CL,(int *)&stack0xffffffffffffff1c,(int *)&stack0xffffffffffffff18);
  load_buffer_8x4((int16_t *)CONCAT44(iVar4,iVar2),out,(int)((ulong)p_Var5 >> 0x20),(int)p_Var5,
                  in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  for (local_ec = 0; local_ec < 2; local_ec = local_ec + 1) {
    in_00 = (__m128i *)(local_a8 + (long)(local_ec << 2) * 2);
    (*(code *)out)(in_00,in_00,iVar4,1);
    transpose_32bit_4x4(in_00,in_00);
  }
  col_txfm_4x8_rounding((__m128i *)local_a8,-(int)piVar1[1]);
  (*p_Var5)((__m128i *)local_a8,in_RSI,iVar2,1);
  av1_round_shift_rect_array_32_sse4_1
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x4_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int txfm_size_col = tx_size_wide[TX_8X4];
  const int txfm_size_row = tx_size_high[TX_8X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  load_buffer_8x4(input, in, stride, ud_flip, lr_flip, shift[0]);
  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_4x8_rounding(in, -shift[1]);

  // row tranform
  row_txfm(in, outcoeff128, bitrow, 1);
  av1_round_shift_rect_array_32_sse4_1(outcoeff128, outcoeff128, txfm_size_col,
                                       -shift[2], NewSqrt2);
  (void)bd;
}